

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_fetch_resp(Curl_easy *data,connectdata *conn,int imapcode,imapstate instate)

{
  connectdata *data_00;
  CURLofft CVar1;
  char *buf;
  char *local_70;
  size_t chunk;
  char *endptr;
  curl_off_t size;
  void *pvStack_50;
  _Bool parsed;
  size_t len;
  char *ptr;
  pingpong *pp;
  imap_conn *imapc;
  imapstate local_28;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  imapc._4_4_ = CURLE_OK;
  ptr = (char *)&conn->proto;
  pp = (pingpong *)ptr;
  local_28 = instate;
  result = imapcode;
  _instate_local = conn;
  conn_local = (connectdata *)data;
  len = (size_t)Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  pvStack_50 = (conn_local->cpool_node)._next[0x26]._ptr;
  size._7_1_ = 0;
  endptr = (char *)0x0;
  if (result != CURLE_ABORTED_BY_CALLBACK) {
    Curl_pgrsSetDownloadSize((Curl_easy *)conn_local,-1);
    imap_state((Curl_easy *)conn_local,IMAP_STOP);
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  len = (size_t)memchr((void *)len,0x7b,(size_t)pvStack_50);
  if (((((void *)len != (void *)0x0) &&
       (CVar1 = curlx_strtoofft((char *)(len + 1),(char **)&chunk,10,(curl_off_t *)&endptr),
       CVar1 == CURL_OFFT_OK)) && (1 < (long)(chunk - len))) && (*(char *)chunk == '}')) {
    size._7_1_ = 1;
  }
  if ((size._7_1_ & 1) == 0) {
    Curl_failf((Curl_easy *)conn_local,"Failed to parse FETCH response.");
    imapc._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    if (((conn_local != (connectdata *)0x0) &&
        ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
       ((*(long *)&conn_local[3].shutdown.timeout_ms == 0 ||
        (0 < *(int *)(*(long *)&conn_local[3].shutdown.timeout_ms + 8))))) {
      Curl_infof((Curl_easy *)conn_local,"Found %ld bytes to download",endptr);
    }
    Curl_pgrsSetDownloadSize((Curl_easy *)conn_local,(curl_off_t)endptr);
    if (*(long *)(ptr + 0x80) != 0) {
      local_70 = *(char **)(ptr + 0x80);
      Curl_dyn_tail((dynbuf *)(ptr + 0x60),(size_t)local_70);
      data_00 = conn_local;
      ptr[0x88] = '\0';
      ptr[0x89] = '\0';
      ptr[0x8a] = '\0';
      ptr[0x8b] = '\0';
      ptr[0x8c] = '\0';
      ptr[0x8d] = '\0';
      ptr[0x8e] = '\0';
      ptr[0x8f] = '\0';
      if (endptr < local_70) {
        local_70 = endptr;
      }
      if (local_70 == (char *)0x0) {
        imap_state((Curl_easy *)conn_local,IMAP_STOP);
        return CURLE_OK;
      }
      buf = Curl_dyn_ptr((dynbuf *)(ptr + 0x60));
      imapc._4_4_ = Curl_client_write((Curl_easy *)data_00,1,buf,(size_t)local_70);
      if (imapc._4_4_ != CURLE_OK) {
        return imapc._4_4_;
      }
      if (((conn_local != (connectdata *)0x0) &&
          ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
         ((*(long *)&conn_local[3].shutdown.timeout_ms == 0 ||
          (0 < *(int *)(*(long *)&conn_local[3].shutdown.timeout_ms + 8))))) {
        Curl_infof((Curl_easy *)conn_local,"Written %zu bytes, %lu bytes are left for transfer",
                   local_70,(long)endptr - (long)local_70);
      }
      if (local_70 < *(char **)(ptr + 0x80)) {
        *(long *)(ptr + 0x80) = *(long *)(ptr + 0x80) - (long)local_70;
        Curl_dyn_tail((dynbuf *)(ptr + 0x60),*(size_t *)(ptr + 0x80));
      }
      else {
        ptr[0x80] = '\0';
        ptr[0x81] = '\0';
        ptr[0x82] = '\0';
        ptr[0x83] = '\0';
        ptr[0x84] = '\0';
        ptr[0x85] = '\0';
        ptr[0x86] = '\0';
        ptr[0x87] = '\0';
        Curl_dyn_reset((dynbuf *)(ptr + 0x60));
      }
    }
    if (*(char **)&(conn_local->http_proxy).port == endptr) {
      Curl_xfer_setup_nop((Curl_easy *)conn_local);
    }
    else {
      (conn_local->http_proxy).host.dispname = endptr;
      *(undefined1 *)((long)&conn_local[3].proxy_ssl_config.CApath + 3) = 1;
      Curl_xfer_setup1((Curl_easy *)conn_local,1,(curl_off_t)endptr,false);
    }
  }
  imap_state((Curl_easy *)conn_local,IMAP_STOP);
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_state_fetch_resp(struct Curl_easy *data,
                                      struct connectdata *conn, int imapcode,
                                      imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  const char *ptr = Curl_dyn_ptr(&data->conn->proto.imapc.pp.recvbuf);
  size_t len = data->conn->proto.imapc.pp.nfinal;
  bool parsed = FALSE;
  curl_off_t size = 0;

  (void)instate; /* no use for this yet */

  if(imapcode != '*') {
    Curl_pgrsSetDownloadSize(data, -1);
    imap_state(data, IMAP_STOP);
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }

  /* Something like this is received "* 1 FETCH (BODY[TEXT] {2021}\r" so parse
     the continuation data contained within the curly brackets */
  ptr = memchr(ptr, '{', len);
  if(ptr) {
    char *endptr;
    if(!curlx_strtoofft(ptr + 1, &endptr, 10, &size) &&
       (endptr - ptr > 1 && *endptr == '}'))
      parsed = TRUE;
  }

  if(parsed) {
    infof(data, "Found %" FMT_OFF_T " bytes to download", size);
    Curl_pgrsSetDownloadSize(data, size);

    if(pp->overflow) {
      /* At this point there is a data in the receive buffer that is body
         content, send it as body and then skip it. Do note that there may
         even be additional "headers" after the body. */
      size_t chunk = pp->overflow;

      /* keep only the overflow */
      Curl_dyn_tail(&pp->recvbuf, chunk);
      pp->nfinal = 0; /* done */

      if(chunk > (size_t)size)
        /* The conversion from curl_off_t to size_t is always fine here */
        chunk = (size_t)size;

      if(!chunk) {
        /* no size, we are done with the data */
        imap_state(data, IMAP_STOP);
        return CURLE_OK;
      }
      result = Curl_client_write(data, CLIENTWRITE_BODY,
                                 Curl_dyn_ptr(&pp->recvbuf), chunk);
      if(result)
        return result;

      infof(data, "Written %zu bytes, %" FMT_OFF_TU
            " bytes are left for transfer", chunk, size - chunk);

      /* Have we used the entire overflow or just part of it?*/
      if(pp->overflow > chunk) {
        /* remember the remaining trailing overflow data */
        pp->overflow -= chunk;
        Curl_dyn_tail(&pp->recvbuf, pp->overflow);
      }
      else {
        pp->overflow = 0; /* handled */
        /* Free the cache */
        Curl_dyn_reset(&pp->recvbuf);
      }
    }

    if(data->req.bytecount == size)
      /* The entire data is already transferred! */
      Curl_xfer_setup_nop(data);
    else {
      /* IMAP download */
      data->req.maxdownload = size;
      /* force a recv/send check of this connection, as the data might've been
       read off the socket already */
      data->state.select_bits = CURL_CSELECT_IN;
      Curl_xfer_setup1(data, CURL_XFER_RECV, size, FALSE);
    }
  }
  else {
    /* We do not know how to parse this line */
    failf(data, "Failed to parse FETCH response.");
    result = CURLE_WEIRD_SERVER_REPLY;
  }

  /* End of DO phase */
  imap_state(data, IMAP_STOP);

  return result;
}